

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,RE *regex,char *file,int line,
          DeathTest **test)

{
  bool bVar1;
  int iVar2;
  TestInfo *this_00;
  char *pcVar3;
  string *__lhs;
  ExecDeathTest *this_01;
  NoExecDeathTest *this_02;
  int __c;
  int __c_00;
  int __c_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  int local_11c;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  InternalRunDeathTestFlag *pIStack_50;
  int death_test_index;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  DeathTest **test_local;
  char *pcStack_30;
  int line_local;
  char *file_local;
  RE *regex_local;
  char *statement_local;
  DefaultDeathTestFactory *this_local;
  
  impl = (UnitTestImpl *)test;
  test_local._4_4_ = line;
  pcStack_30 = file;
  file_local = (char *)regex;
  regex_local = (RE *)statement;
  statement_local = (char *)this;
  flag = (InternalRunDeathTestFlag *)GetUnitTestImpl();
  pIStack_50 = UnitTestImpl::internal_run_death_test_flag((UnitTestImpl *)flag);
  this_00 = UnitTestImpl::current_test_info((UnitTestImpl *)flag);
  iVar2 = TestInfo::increment_death_test_count(this_00);
  local_54 = iVar2;
  if (pIStack_50 != (InternalRunDeathTestFlag *)0x0) {
    pcVar3 = InternalRunDeathTestFlag::index(pIStack_50,statement,__c);
    if ((int)pcVar3 < iVar2) {
      StreamableToString<int>(&local_f8,&local_54);
      std::operator+(&local_d8,"Death test count (",&local_f8);
      __lhs_00 = &local_d8;
      std::operator+(&local_b8,__lhs_00,") somehow exceeded expected maximum (");
      pcVar3 = InternalRunDeathTestFlag::index(pIStack_50,(char *)__lhs_00,__c_00);
      local_11c = (int)pcVar3;
      StreamableToString<int>(&local_118,&local_11c);
      std::operator+(&local_98,&local_b8,&local_118);
      std::operator+(&local_78,&local_98,")");
      DeathTest::set_last_death_test_message(&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      return false;
    }
    __lhs = InternalRunDeathTestFlag::file_abi_cxx11_(pIStack_50);
    pcVar3 = pcStack_30;
    bVar1 = std::operator==(__lhs,pcStack_30);
    if (((!bVar1) || (iVar2 = InternalRunDeathTestFlag::line(pIStack_50), iVar2 != test_local._4_4_)
        ) || (pcVar3 = InternalRunDeathTestFlag::index(pIStack_50,pcVar3,__c_01),
             (int)pcVar3 != local_54)) {
      impl->_vptr_UnitTestImpl = (_func_int **)0x0;
      return true;
    }
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  if (bVar1) {
    this_01 = (ExecDeathTest *)operator_new(0x40);
    ExecDeathTest::ExecDeathTest
              (this_01,(char *)regex_local,(RE *)file_local,pcStack_30,test_local._4_4_);
    impl->_vptr_UnitTestImpl = (_func_int **)this_01;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            FLAGS_gtest_death_test_style_abi_cxx11_,"fast");
    if (!bVar1) {
      std::operator+(&local_160,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      std::operator+(&local_140,&local_160,"\" encountered");
      DeathTest::set_last_death_test_message(&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      return false;
    }
    this_02 = (NoExecDeathTest *)operator_new(0x30);
    NoExecDeathTest::NoExecDeathTest(this_02,(char *)regex_local,(RE *)file_local);
    impl->_vptr_UnitTestImpl = (_func_int **)this_02;
  }
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement, const RE* regex,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != NULL) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = NULL;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, regex, file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, regex, file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, regex);
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }